

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O1

void __thiscall
sqlcheck::TestSuite_QueryTests_Test::~TestSuite_QueryTests_Test(TestSuite_QueryTests_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, QueryTests) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "SELECT * FROM Bugs WHERE assigned_to IS NULL OR assigned_to <> 1;\n"

      "SELECT first_name || ' ' || last_name AS full_name FROM Accounts;\n"

      "SELECT product_id, MAX(date_reported) AS latest,"
      "MIN(date_reported) AS earliest, bug_id"
      "FROM Bugs JOIN BugsProducts USING (bug_id)"
      "GROUP BY product_id;\n"

      "SELECT product_id, MAX(date_reported) AS latest"
      "FROM Bugs JOIN BugsProducts USING (bug_id)"
      "GROUP BY product_id;\n"

      "SELECT * FROM Bugs ORDER BY RAND() LIMIT 1;\n"

      "SELECT b1.*"
      "FROM Bugs AS b1"
      "JOIN (SELECT CEIL(RAND() * (SELECT MAX(bug_id) FROM Bugs)) AS rand_id) AS b2"
      "ON (b1.bug_id = b2.rand_id);\n"

      "SELECT * FROM Bugs WHERE description LIKE '%crash%';\n"

      "SELECT * FROM Bugs WHERE description REGEXP 'crash';\n"

      "SELECT COUNT(bp.product_id) AS how_many_products,"
      "COUNT(dev.account_id) AS how_many_developers,"
      "COUNT(b.bug_id)/COUNT(dev.account_id) AS avg_bugs_per_developer,"
      "COUNT(cust.account_id) AS how_many_customers"
      "FROM Bugs b JOIN BugsProducts bp ON (b.bug_id = bp.bug_id)"
      "JOIN Accounts dev ON (b.assigned_to = dev.account_id)"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "GROUP BY bp.product_id;"

      "SELECT AVG(bugs_per_developer) AS average_bugs_per_developer"
      "FROM (SELECT dev.account_id, COUNT(*) AS bugs_per_developer"
      "FROM Bugs b JOIN Accounts dev"
      "ON (b.assigned_to = dev.account_id)"
      "WHERE b.status = 'FIXED' GROUP BY dev.account_id) t;\n"

      "INSERT INTO Bugs VALUES (DEFAULT, CURDATE(), 'New bug', 'Test T987 fails...',"
      "NULL, 123, NULL, NULL, DEFAULT, 'Medium', NULL);\n"

      "INSERT INTO Accounts (account_name, first_name, last_name, email,"
      "password_hash, portrait_image, hourly_rate)"
      "VALUES ('bkarwin', 'Bill', 'Karwin', 'bill@example.com', SHA2('xyzzy'), NULL, 49.95);\n"

      "CREATE TABLE Accounts ("
      "account_id    SERIAL PRIMARY KEY,"
      "account_name  VARCHAR(20) NOT NULL,"
      "email         VARCHAR(100) NOT NULL,"
      "password      VARCHAR(30) NOT NULL"
      ");\n"

      "SELECT * FROM Accounts"
      "WHERE account_name = 'bill' AND password = 'opensesame';\n"

      "SELECT s.cust_id,count(s.cust_id) FROM  SH.sales s GROUP BY s.cust_id\n"
      "HAVING s.cust_id != '1660' AND s.cust_id != '2';\n"

      "SELECT * FROM SH.products p WHERE p.prod_id = (SELECT s.prod_id FROM SH.sales s"
      "WHERE s.cust_id = 100996 AND s.quantity_sold = 1 );\n"

      "SELECT s.* FROM SH.sales s WHERE s.prod_id = 14 OR s.prod_id = 17;\n"

      "SELECT cust_id FROM SH.sales UNION SELECT cust_id FROM customers;\n"

      "SELECT DISTINCT c.country_id, c.country_name FROM SH.countries c JOIN SH.customers e"
      "WHERE e.country_id = c.country_id;\n"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}